

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gdcmpgif.c
# Opt level: O1

void CompareImages(char *msg,gdImagePtr im1,gdImagePtr im2)

{
  uint uVar1;
  char *pcVar2;
  
  uVar1 = gdImageCompare(im1,im2);
  if ((uVar1 & 1) == 0) {
    if (uVar1 == 0) {
      pcVar2 = "%%%s: OK\n";
      goto LAB_001013b8;
    }
    pcVar2 = "%%%s: WARNING images differ: WARNING - Probably OK\n";
  }
  else {
    pcVar2 = "%%%s: ERROR images differ: BAD\n";
  }
  printf(pcVar2,msg);
  if ((uVar1 & 0x18) != 0) {
    printf("-%s: INFO image sizes differ\n",msg);
  }
  if ((uVar1 & 2) != 0) {
    printf("-%s: INFO number of palette entries differ %d Vs. %d\n",msg,
           (ulong)(uint)im1->colorsTotal,(ulong)(uint)im2->colorsTotal);
  }
  if ((uVar1 & 4) == 0) {
    return;
  }
  pcVar2 = "-%s: INFO actual colours of pixels differ\n";
LAB_001013b8:
  printf(pcVar2,msg);
  return;
}

Assistant:

void CompareImages(char *msg, gdImagePtr im1, gdImagePtr im2)
{
	int cmpRes;

	cmpRes = gdImageCompare(im1, im2);

	if (cmpRes & GD_CMP_IMAGE) {
		printf("%%%s: ERROR images differ: BAD\n",msg);
	} else if (cmpRes != 0) {
		printf("%%%s: WARNING images differ: WARNING - Probably OK\n",msg);
	} else {
		printf("%%%s: OK\n",msg);
		return;
	}

	if (cmpRes & (GD_CMP_SIZE_X + GD_CMP_SIZE_Y)) {
		printf("-%s: INFO image sizes differ\n",msg);
	}

	if (cmpRes & GD_CMP_NUM_COLORS) {
		printf("-%s: INFO number of palette entries differ %d Vs. %d\n",msg,
		       im1->colorsTotal, im2->colorsTotal);
	}

	if (cmpRes & GD_CMP_COLOR) {
		printf("-%s: INFO actual colours of pixels differ\n",msg);
	}
}